

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::PricingSession::OnSubscriptionStatus
          (PricingSession *this,Subject *subject,SubscriptionStatus status,string *reason)

{
  bool bVar1;
  pointer ppVar2;
  reference __x;
  exception *e;
  undefined1 local_80 [8];
  function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)> callback;
  iterator __end2;
  iterator __begin2;
  vector<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
  *__range2;
  shared_ptr<bidfx_public_api::SubscriptionStatusEvent> event;
  _Self local_30;
  iterator subscription_it;
  string *reason_local;
  Subject *pSStack_18;
  SubscriptionStatus status_local;
  Subject *subject_local;
  PricingSession *this_local;
  
  subscription_it._M_node = (_Base_ptr)reason;
  reason_local._4_4_ = status;
  pSStack_18 = subject;
  subject_local = (Subject *)this;
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->running_);
  if (bVar1) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>_>
         ::find(&this->subscriptions_,pSStack_18);
    event.super___shared_ptr<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>_>
         ::end(&this->subscriptions_);
    bVar1 = std::operator!=(&local_30,
                            (_Self *)&event.
                                      super___shared_ptr<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>
               ::operator->(&local_30);
      Subscription::SetStatus(&ppVar2->second,reason_local._4_4_);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>
               ::operator->(&local_30);
      Subscription::ClearPriceFields(&ppVar2->second);
    }
    std::
    make_shared<bidfx_public_api::SubscriptionStatusEvent,bidfx_public_api::price::subject::Subject_const&,bidfx_public_api::SubscriptionStatus&,std::__cxx11::string&>
              ((Subject *)&__range2,(SubscriptionStatus *)pSStack_18,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&reason_local + 4));
    __end2 = std::
             vector<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
             ::begin(&this->subscription_status_callback_);
    callback._M_invoker =
         (_Invoker_type)
         std::
         vector<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
         ::end(&this->subscription_status_callback_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_*,_std::vector<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>_>
                                       *)&callback._M_invoker), bVar1) {
      __x = __gnu_cxx::
            __normal_iterator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_*,_std::vector<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>_>
            ::operator*(&__end2);
      std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>::function
                ((function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)> *)
                 local_80,__x);
      std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>::shared_ptr
                ((shared_ptr<bidfx_public_api::SubscriptionStatusEvent> *)&e,
                 (shared_ptr<bidfx_public_api::SubscriptionStatusEvent> *)&__range2);
      std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>::operator()
                ((function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)> *)
                 local_80,(shared_ptr<bidfx_public_api::SubscriptionStatusEvent> *)&e);
      std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>::~shared_ptr
                ((shared_ptr<bidfx_public_api::SubscriptionStatusEvent> *)&e);
      std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>::~function
                ((function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)> *)
                 local_80);
      __gnu_cxx::
      __normal_iterator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_*,_std::vector<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>_>
      ::operator++(&__end2);
    }
    std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>::~shared_ptr
              ((shared_ptr<bidfx_public_api::SubscriptionStatusEvent> *)&__range2);
  }
  return;
}

Assistant:

void PricingSession::OnSubscriptionStatus(const Subject& subject, SubscriptionStatus status, std::string reason)
{
    if (!running_)
    {
        return;
    }
    auto subscription_it = subscriptions_.find(subject);
    if (subscription_it != subscriptions_.end())
    {
        subscription_it->second.SetStatus(status);
        subscription_it->second.ClearPriceFields();
    }

    std::shared_ptr<SubscriptionStatusEvent> event = std::make_shared<SubscriptionStatusEvent>(subject, status, reason);
    try
    {
        for (auto callback : subscription_status_callback_)
        {
            callback(event);
        }
    }
    catch (std::exception &e)
    {
        Log->warn("error handling price status {}", e.what());
        throw e;
    }
}